

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kgc.cpp
# Opt level: O2

Value * __thiscall Kgc::allocNew(Kgc *this,ValueType type)

{
  Value *pVVar1;
  undefined **ppuVar2;
  
  switch(type) {
  case BOOLEAN:
    pVVar1 = (Value *)operator_new(0x20);
    pVVar1->type_ = BOOLEAN;
    pVVar1->marked_ = 0;
    pVVar1->next_ = (Value *)0x0;
    pVVar1->_vptr_Value = (_func_int **)&PTR__Value_00114d00;
    *(undefined1 *)&pVVar1[1]._vptr_Value = 0;
    return pVVar1;
  case STRING:
    pVVar1 = (Value *)operator_new(0x20);
    pVVar1->type_ = STRING;
    pVVar1->marked_ = 0;
    pVVar1->next_ = (Value *)0x0;
    pVVar1[1]._vptr_Value = (_func_int **)0x0;
    ppuVar2 = &PTR__Value_00114d38;
    break;
  case NIL:
    pVVar1 = (Value *)operator_new(0x18);
    pVVar1->type_ = NIL;
    pVVar1->marked_ = 0;
    pVVar1->next_ = (Value *)0x0;
    ppuVar2 = &PTR__Value_00114c90;
    break;
  case CELL:
    pVVar1 = (Value *)operator_new(0x28);
    pVVar1->type_ = CELL;
    pVVar1->marked_ = 0;
    pVVar1->next_ = (Value *)0x0;
    pVVar1->_vptr_Value = (_func_int **)&PTR__Value_00114bb0;
    pVVar1[1]._vptr_Value = (_func_int **)0x0;
    pVVar1[1].type_ = BOOLEAN;
    pVVar1[1].marked_ = 0;
    return pVVar1;
  case SYMBOL:
    pVVar1 = (Value *)operator_new(0x20);
    pVVar1->type_ = SYMBOL;
    pVVar1->marked_ = 0;
    pVVar1->next_ = (Value *)0x0;
    pVVar1[1]._vptr_Value = (_func_int **)0x0;
    ppuVar2 = &PTR__Value_00114d70;
    break;
  case PRIM_PROC:
    pVVar1 = (Value *)operator_new(0x20);
    pVVar1->type_ = PRIM_PROC;
    pVVar1->marked_ = 0;
    pVVar1->next_ = (Value *)0x0;
    pVVar1[1]._vptr_Value = (_func_int **)0x0;
    ppuVar2 = &PTR__Value_00114c58;
    break;
  case COMP_PROC:
    pVVar1 = (Value *)operator_new(0x30);
    pVVar1->type_ = COMP_PROC;
    pVVar1->marked_ = 0;
    pVVar1->next_ = (Value *)0x0;
    pVVar1->_vptr_Value = (_func_int **)&PTR__Value_00114b68;
    pVVar1[1]._vptr_Value = (_func_int **)0x0;
    pVVar1[1].type_ = BOOLEAN;
    pVVar1[1].marked_ = 0;
    pVVar1[1].next_ = (Value *)0x0;
    return pVVar1;
  case INPUT_PORT:
    pVVar1 = (Value *)operator_new(0x20);
    pVVar1->type_ = INPUT_PORT;
    pVVar1->marked_ = 0;
    pVVar1->next_ = (Value *)0x0;
    pVVar1[1]._vptr_Value = (_func_int **)0x0;
    ppuVar2 = &PTR__InputPort_00114be8;
    break;
  case OUTPUT_PORT:
    pVVar1 = (Value *)operator_new(0x20);
    pVVar1->type_ = INPUT_PORT;
    pVVar1->marked_ = 0;
    pVVar1->next_ = (Value *)0x0;
    pVVar1[1]._vptr_Value = (_func_int **)0x0;
    ppuVar2 = &PTR__OutputPort_00114c20;
    break;
  case EOF_OBJECT:
    pVVar1 = (Value *)operator_new(0x18);
    pVVar1->type_ = EOF_OBJECT;
    pVVar1->marked_ = 0;
    pVVar1->next_ = (Value *)0x0;
    ppuVar2 = &PTR__Value_00114cc8;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jfourkiotis[P]kat/kgc.cpp"
                  ,0x94,"Value *Kgc::allocNew(ValueType)");
  }
  pVVar1->_vptr_Value = (_func_int **)ppuVar2;
  return pVVar1;
}

Assistant:

Value* Kgc::allocNew(ValueType type)
{
    switch (type)
    {
        case ValueType::COMP_PROC:
            return new CompoundProc;
        case ValueType::CELL:
            return new Cell;
        case ValueType::INPUT_PORT:
            return new InputPort;
        case ValueType::OUTPUT_PORT:
            return new OutputPort;
        case ValueType::PRIM_PROC:
            return new PrimitiveProc;
        case ValueType::BOOLEAN:
            return new Boolean;
        case ValueType::STRING:
            return new String;
        case ValueType::SYMBOL:
            return new Symbol;
        case ValueType::NIL:
            return new Nil;
        case ValueType::EOF_OBJECT:
            return new Eof;
        default:
            assert(false);
            return nullptr;
    }
}